

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDetect.c
# Opt level: O0

char * Io_WriteFinType(int Type)

{
  char *pcStack_10;
  int Type_local;
  
  if (Type == -99) {
    pcStack_10 = "SA0";
  }
  else if (Type == -0x62) {
    pcStack_10 = "SA1";
  }
  else if (Type == -0x61) {
    pcStack_10 = "NEG";
  }
  else if (Type == -0x60) {
    pcStack_10 = "RDOB_AND";
  }
  else if (Type == -0x5f) {
    pcStack_10 = "RDOB_NAND";
  }
  else if (Type == -0x5e) {
    pcStack_10 = "RDOB_OR";
  }
  else if (Type == -0x5d) {
    pcStack_10 = "RDOB_NOR";
  }
  else if (Type == -0x5c) {
    pcStack_10 = "RDOB_XOR";
  }
  else if (Type == -0x5b) {
    pcStack_10 = "RDOB_NXOR";
  }
  else if (Type == -0x5a) {
    pcStack_10 = "RDOB_NOT";
  }
  else if (Type == -0x59) {
    pcStack_10 = "RDOB_BUFF";
  }
  else {
    pcStack_10 = "Unknown";
  }
  return pcStack_10;
}

Assistant:

char * Io_WriteFinType( int Type )
{
    if ( Type == ABC_FIN_SA0 )          return "SA0";
    if ( Type == ABC_FIN_SA1 )          return "SA1";
    if ( Type == ABC_FIN_NEG )          return "NEG";
    if ( Type == ABC_FIN_RDOB_AND  )    return "RDOB_AND" ;
    if ( Type == ABC_FIN_RDOB_NAND )    return "RDOB_NAND";
    if ( Type == ABC_FIN_RDOB_OR   )    return "RDOB_OR"  ;
    if ( Type == ABC_FIN_RDOB_NOR  )    return "RDOB_NOR" ;
    if ( Type == ABC_FIN_RDOB_XOR  )    return "RDOB_XOR" ;
    if ( Type == ABC_FIN_RDOB_NXOR )    return "RDOB_NXOR";
    if ( Type == ABC_FIN_RDOB_NOT  )    return "RDOB_NOT" ;
    if ( Type == ABC_FIN_RDOB_BUFF )    return "RDOB_BUFF";
    return "Unknown";
}